

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O0

ssize_t __thiscall
libnbt::NBTTagVector<signed_char>::write
          (NBTTagVector<signed_char> *this,int __fd,void *__buf,size_t __n)

{
  size_type sVar1;
  reference pvVar2;
  undefined4 in_register_00000034;
  value_type local_21;
  uint local_20;
  int iStack_1c;
  char temp;
  int i;
  int32_t size;
  ostream *out_local;
  NBTTagVector<signed_char> *this_local;
  
  _i = (ostream *)CONCAT44(in_register_00000034,__fd);
  out_local = (ostream *)this;
  sVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&this->array);
  iStack_1c = (int)sVar1;
  writeBytes(_i,(char *)&stack0xffffffffffffffe4,'\x04');
  for (local_20 = 0; (int)local_20 < iStack_1c; local_20 = local_20 + 1) {
    pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->array,(long)(int)local_20);
    local_21 = *pvVar2;
    writeBytes(_i,&local_21,width);
  }
  return (ulong)local_20;
}

Assistant:

void NBTTagVector<T>::write(std::ostream &out) {
        auto size = (int32_t) array.size();
        writeBytes(out, (char *) &size, 4);
        for (int i = 0; i < size; i++) {
            T temp = array[i];
            writeBytes(out, (char *) &temp, width);
        }
    }